

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall
jsonnet::internal::Conditional::Conditional
          (Conditional *this,LocationRange *lr,Fodder *open_fodder,AST *cond,Fodder *then_fodder,
          AST *branch_true,Fodder *else_fodder,AST *branch_false)

{
  AST::AST(&this->super_AST,lr,AST_CONDITIONAL,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__Conditional_0022bd68;
  this->cond = cond;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->thenFodder,then_fodder);
  this->branchTrue = branch_true;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->elseFodder,else_fodder);
  this->branchFalse = branch_false;
  return;
}

Assistant:

Conditional(const LocationRange &lr, const Fodder &open_fodder, AST *cond,
                const Fodder &then_fodder, AST *branch_true, const Fodder &else_fodder,
                AST *branch_false)
        : AST(lr, AST_CONDITIONAL, open_fodder),
          cond(cond),
          thenFodder(then_fodder),
          branchTrue(branch_true),
          elseFodder(else_fodder),
          branchFalse(branch_false)
    {
    }